

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

_Bool is_quest(player *p,wchar_t level)

{
  ulong local_28;
  size_t i;
  wchar_t level_local;
  player *p_local;
  
  if (level != L'\0') {
    for (local_28 = 0; local_28 < z_info->quest_max; local_28 = local_28 + 1) {
      if ((uint)p->quests[local_28].level == level) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_quest(struct player *p, int level)
{
	size_t i;

	/* Town is never a quest */
	if (!level) return false;

	for (i = 0; i < z_info->quest_max; i++)
		if (p->quests[i].level == level)
			return true;

	return false;
}